

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O1

void __thiscall
HawkTracer::client::TracepointMap::add_map_entry(TracepointMap *this,uint64_t id,string *label)

{
  pointer pcVar1;
  mapped_type *pmVar2;
  MapInfo info;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined4 *local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined3 uStack_34;
  undefined1 local_31;
  uint64_t local_28;
  
  pcVar1 = (label->_M_dataplus)._M_p;
  local_68[0] = local_58;
  local_28 = id;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_68,pcVar1,pcVar1 + label->_M_string_length);
  local_38 = 0x61666564;
  uStack_34 = 0x746c75;
  local_40 = 7;
  local_31 = 0;
  local_48 = &local_38;
  pmVar2 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this,&local_28);
  std::__cxx11::string::_M_assign((string *)pmVar2);
  std::__cxx11::string::_M_assign((string *)&pmVar2->category);
  if (local_48 != &local_38) {
    operator_delete(local_48);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return;
}

Assistant:

void TracepointMap::add_map_entry(uint64_t id, std::string label)
{
    MapInfo info = { label, category_to_string(Unknown) };
    _input_map[id] = info;
}